

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall logger::Channel::SetPrefix(Channel *this,string *prefix)

{
  std::mutex::lock(&this->PrefixLock);
  std::__cxx11::string::_M_assign((string *)&this->Prefix);
  pthread_mutex_unlock((pthread_mutex_t *)&this->PrefixLock);
  return;
}

Assistant:

void Channel::SetPrefix(const std::string& prefix)
{
    std::lock_guard<std::mutex> locker(PrefixLock);
    Prefix = prefix;
}